

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_with_face(REF_CELL ref_cell,REF_INT *face_nodes,REF_INT *cell0,REF_INT *cell1)

{
  REF_ADJ pRVar1;
  REF_INT *pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  uint uVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  REF_INT ncandidate;
  REF_INT ntarget;
  ulong local_1a0;
  int *local_198;
  int *local_190;
  REF_INT orig [27];
  REF_INT candidate [27];
  REF_INT target [27];
  
  *cell0 = -1;
  *cell1 = -1;
  uVar5 = ref_sort_unique_int(4,face_nodes,&ntarget,target);
  if (uVar5 == 0) {
    iVar9 = *face_nodes;
    local_1a0 = 0xffffffff;
    iVar11 = -1;
    if (-1 < (long)iVar9) {
      pRVar1 = ref_cell->ref_adj;
      local_1a0 = 0xffffffff;
      iVar11 = -1;
      if (iVar9 < pRVar1->nnode) {
        uVar5 = pRVar1->first[iVar9];
        local_1a0 = 0xffffffff;
        iVar11 = -1;
        if ((long)(int)uVar5 != -1) {
          iVar11 = pRVar1->item[(int)uVar5].ref;
          local_1a0 = (ulong)uVar5;
        }
      }
    }
    local_198 = cell1;
    local_190 = cell0;
    while (uVar5 = 0, (int)local_1a0 != -1) {
      for (lVar12 = 0; lVar12 < ref_cell->face_per; lVar12 = lVar12 + 1) {
        pRVar2 = ref_cell->c2n;
        iVar9 = ref_cell->size_per;
        pRVar3 = ref_cell->f2n;
        for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
          orig[lVar10] = pRVar2[(long)pRVar3[(ulong)((uint)lVar12 & 0x3fffffff) * 4 + lVar10] +
                                (long)iVar9 * (long)iVar11];
        }
        uVar5 = ref_sort_unique_int(4,orig,&ncandidate,candidate);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x463,"ref_cell_with_face",(ulong)uVar5,"c uniq");
          return uVar5;
        }
        if (ntarget == ncandidate) {
          uVar7 = 0;
          uVar8 = 0;
          if (0 < ntarget) {
            uVar8 = (ulong)(uint)ntarget;
          }
          iVar9 = 0;
          for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
            iVar9 = iVar9 + (uint)(target[uVar7] == candidate[uVar7]);
          }
          if (ntarget == iVar9) {
            piVar6 = local_190;
            if ((*local_190 != -1) && (piVar6 = local_198, *local_198 != -1)) {
              return 3;
            }
            *piVar6 = iVar11;
          }
        }
      }
      pRVar4 = ref_cell->ref_adj->item;
      local_1a0 = (ulong)pRVar4[(int)local_1a0].next;
      iVar11 = -1;
      if (local_1a0 != 0xffffffffffffffff) {
        iVar11 = pRVar4[local_1a0].ref;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x45c,
           "ref_cell_with_face",(ulong)uVar5,"t uniq");
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_cell_with_face(REF_CELL ref_cell, REF_INT *face_nodes,
                                      REF_INT *cell0, REF_INT *cell1) {
  REF_INT item, node, same, cell_face, cell;
  REF_INT ntarget, target[REF_CELL_MAX_SIZE_PER];
  REF_INT ncandidate, candidate[REF_CELL_MAX_SIZE_PER];
  REF_INT orig[REF_CELL_MAX_SIZE_PER];

  (*cell0) = REF_EMPTY;
  (*cell1) = REF_EMPTY;

  RSS(ref_sort_unique_int(4, face_nodes, &ntarget, target), "t uniq");

  each_ref_cell_having_node(ref_cell, face_nodes[0], item, cell) {
    each_ref_cell_cell_face(ref_cell, cell_face) {
      for (node = 0; node < 4; node++) {
        orig[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
      }
      RSS(ref_sort_unique_int(4, orig, &ncandidate, candidate), "c uniq");

      if (ntarget == ncandidate) {
        same = 0;
        for (node = 0; node < ntarget; node++) {
          if (target[node] == candidate[node]) same++;
        }

        if (ntarget == same) {
          if (REF_EMPTY == *cell0) {
            (*cell0) = cell;
          } else {
            if (REF_EMPTY != *cell1)
              return REF_INVALID; /* more than 2 cells with face */
            (*cell1) = cell;
          }
        }
      }
    }
  }

  return REF_SUCCESS;
}